

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_echo_server.cpp
# Opt level: O1

void __thiscall
EchoServer::onMessage(EchoServer *this,TcpConnectionPtr *conn,string *message,Timestamp receiveTime)

{
  ulong __n;
  int iVar1;
  int in_R8D;
  SourceFile file;
  Logger local_ff8;
  
  if ((this->m_mode == 1) && (sznet::g_logLevel < 3)) {
    file._8_8_ = 0x13;
    file.m_data = "tcp_echo_server.cpp";
    sznet::Logger::Logger(&local_ff8,file,0x4a);
    receiveTime.m_microSecondsSinceEpoch = (int64_t)local_ff8.m_impl.m_stream.m_buffer.m_cur;
    iVar1 = (int)&local_ff8 + 0xfb0;
    if (0xd < (uint)(iVar1 - (int)local_ff8.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_ff8.m_impl.m_stream.m_buffer.m_cur,"server recv: ",0xd);
      local_ff8.m_impl.m_stream.m_buffer.m_cur = local_ff8.m_impl.m_stream.m_buffer.m_cur + 0xd;
    }
    __n = message->_M_string_length;
    if (__n < (ulong)(long)(iVar1 - (int)local_ff8.m_impl.m_stream.m_buffer.m_cur)) {
      memcpy(local_ff8.m_impl.m_stream.m_buffer.m_cur,(message->_M_dataplus)._M_p,__n);
      local_ff8.m_impl.m_stream.m_buffer.m_cur = local_ff8.m_impl.m_stream.m_buffer.m_cur + __n;
    }
    sznet::Logger::~Logger(&local_ff8);
  }
  local_ff8.m_impl.m_time.m_microSecondsSinceEpoch = (int64_t)(message->_M_dataplus)._M_p;
  local_ff8.m_impl.m_stream._0_4_ = *(undefined4 *)&message->_M_string_length;
  sznet::net::LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_>::send
            (&this->m_codec,
             (int)(conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr,&local_ff8,receiveTime.m_microSecondsSinceEpoch,in_R8D);
  LOCK();
  (this->m_transferred).super___atomic_base<long>._M_i =
       (this->m_transferred).super___atomic_base<long>._M_i + message->_M_string_length;
  UNLOCK();
  LOCK();
  (this->m_receivedMessages).super___atomic_base<long>._M_i =
       (this->m_receivedMessages).super___atomic_base<long>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void onMessage(const sznet::net::TcpConnectionPtr& conn, const sznet::string& message, sznet::Timestamp receiveTime)
    {
        if (m_mode == 1)
        {
            LOG_INFO << "server recv: " << message;
        }
        m_codec.send(get_pointer(conn), message);
        size_t len = message.size();
        m_transferred.fetch_add(len);
        ++m_receivedMessages;
        (void)receiveTime;
    }